

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool AddSourceFile(char **buf,char *name)

{
  char *pcVar1;
  FILE *__stream;
  size_t sVar2;
  
  __stream = fopen(name,"r");
  if (__stream != (FILE *)0x0) {
    pcVar1 = *buf;
    *buf = pcVar1 + 1;
    *pcVar1 = ' ';
    strcpy(*buf,name);
    pcVar1 = *buf;
    sVar2 = strlen(pcVar1);
    *buf = pcVar1 + sVar2;
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool AddSourceFile(char *&buf, const char *name)
{
	if(FILE *file = fopen(name, "r"))
	{
		*(buf++) = ' ';
		strcpy(buf, name);
		buf += strlen(buf);

		fclose(file);

		return true;
	}

	return false;
}